

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O0

int __thiscall ComplexType::serialise(ComplexType *this,uint8_t *buf,size_t max_len)

{
  bool bVar1;
  int iVar2;
  __shared_ptr *this_00;
  element_type *peVar3;
  size_t sVar4;
  uint8_t *buf_00;
  int num_length_bytes;
  int length;
  shared_ptr<BER_CONTAINER> *item;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_> *__range1
  ;
  uint8_t *puStack_48;
  int internalLength;
  uint8_t *internalPtr;
  uint8_t *len_ptr;
  uint8_t *ptr;
  int i;
  size_t max_len_local;
  uint8_t *buf_local;
  ComplexType *this_local;
  
  this_local._4_4_ = BER_CONTAINER::serialise(&this->super_BER_CONTAINER,buf,max_len);
  if (-1 < this_local._4_4_) {
    buf_00 = buf + this_local._4_4_;
    __range1._4_4_ = 0;
    __end1 = std::
             vector<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
             ::begin(&this->values);
    item = (shared_ptr<BER_CONTAINER> *)
           std::
           vector<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>
           ::end(&this->values);
    puStack_48 = buf_00 + 1;
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::shared_ptr<BER_CONTAINER>_*,_std::vector<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>_>
                                       *)&item), bVar1) {
      this_00 = (__shared_ptr *)
                __gnu_cxx::
                __normal_iterator<std::shared_ptr<BER_CONTAINER>_*,_std::vector<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>_>
                ::operator*(&__end1);
      bVar1 = std::__shared_ptr::operator_cast_to_bool(this_00);
      if (!bVar1) {
        return -0x20;
      }
      peVar3 = Catch::clara::std::
               __shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this_00);
      iVar2 = (*peVar3->_vptr_BER_CONTAINER[2])
                        (peVar3,puStack_48,(max_len - (long)__range1._4_4_) + -1);
      if ((iVar2 < 0) && (iVar2 < 0)) {
        return iVar2;
      }
      puStack_48 = puStack_48 + iVar2;
      __range1._4_4_ = iVar2 + __range1._4_4_;
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<BER_CONTAINER>_*,_std::vector<std::shared_ptr<BER_CONTAINER>,_std::allocator<std::shared_ptr<BER_CONTAINER>_>_>_>
      ::operator++(&__end1);
    }
    sVar4 = encode_ber_length_integer_count((long)__range1._4_4_);
    iVar2 = (int)sVar4;
    if (max_len < (ulong)((long)this_local._4_4_ + (long)__range1._4_4_ + (long)iVar2)) {
      this_local._4_4_ = -0x1f;
    }
    else {
      if (1 < iVar2) {
        shift_arr_right(buf_00 + 1,iVar2 + -1,(long)__range1._4_4_);
      }
      sVar4 = encode_ber_length_integer(buf_00,(long)__range1._4_4_,iVar2);
      this_local._4_4_ = __range1._4_4_ + this_local._4_4_ + (int)sVar4;
    }
  }
  return this_local._4_4_;
}

Assistant:

int ComplexType::serialise(uint8_t* buf, size_t max_len){
    int i = BER_CONTAINER::serialise(buf, max_len);
    CHECK_ENCODE_ERR(i);

    uint8_t* ptr = buf + i;
    uint8_t* len_ptr = ptr++;

    uint8_t* internalPtr = ptr; // This is V*

    int internalLength = 0;

    for(const auto& item : values){
        if(!item) return SNMP_BUFFER_ENCODE_ERROR_INVALID_ITEM;
        int length = item->serialise(internalPtr, max_len - internalLength - 1);
        if(length < 0){
            SNMP_LOGD("Item failed to serialiseInto: %d, reason: %d\n", item->_type, length);
            CHECK_ENCODE_ERR(length);
        }
        internalPtr += length;
        internalLength += length;
    }

    int num_length_bytes = encode_ber_length_integer_count(internalLength);
    if(max_len < (size_t)i + internalLength + num_length_bytes) return SNMP_BUFFER_ENCODE_ERR_LEN_EXCEEDED;
    if(num_length_bytes > 1){
        shift_arr_right(ptr, num_length_bytes-1, internalLength);
    }

    // then write the length value
    i += encode_ber_length_integer(len_ptr, internalLength, num_length_bytes); // , max_len_bytes just to be safe
    return internalLength + i;
}